

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

void sym_WriteAnonLabelName(char *buf,uint32_t ofs,bool neg)

{
  char *pcVar1;
  undefined7 in_register_00000011;
  uint uVar2;
  undefined4 in_register_00000034;
  
  if ((int)CONCAT71(in_register_00000011,neg) == 0) {
    if (~anonLabelID < ofs - 1) {
      uVar2 = 0;
      error("Reference to anonymous label %u after, when only %u may still be created\n");
    }
    else {
      uVar2 = anonLabelID + (ofs - 1);
    }
  }
  else {
    uVar2 = anonLabelID - ofs;
    if (anonLabelID < ofs) {
      pcVar1 = "ve";
      if (anonLabelID == 1) {
        pcVar1 = "s";
      }
      uVar2 = 0;
      error("Reference to anonymous label %u before, when only %u ha%s been created so far\n",
            CONCAT44(in_register_00000034,ofs),(ulong)anonLabelID,pcVar1);
    }
  }
  sprintf(buf,"!%u",(ulong)uVar2);
  return;
}

Assistant:

void sym_WriteAnonLabelName(char buf[MIN_NB_ELMS(MAXSYMLEN + 1)], uint32_t ofs, bool neg)
{
	uint32_t id = 0;

	if (neg) {
		if (ofs > anonLabelID)
			error("Reference to anonymous label %" PRIu32 " before, when only %" PRIu32
			      " ha%s been created so far\n",
			      ofs, anonLabelID, anonLabelID == 1 ? "s" : "ve");
		else
			id = anonLabelID - ofs;
	} else {
		ofs--; // We're referencing symbols that haven't been created yet...
		if (ofs > UINT32_MAX - anonLabelID)
			error("Reference to anonymous label %" PRIu32 " after, when only %" PRIu32
			      " may still be created\n", ofs + 1, UINT32_MAX - anonLabelID);
		else
			id = anonLabelID + ofs;
	}

	sprintf(buf, "!%u", id);
}